

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week5-app1.cpp
# Opt level: O0

void print(Date *date)

{
  ostream *poVar1;
  Date *date_local;
  
  if ((date->month == 0) || (date->day == 0)) {
    if (date->month == 0) {
      if (date->year == 0) {
        poVar1 = std::operator<<((ostream *)&std::cout,"<Uninitialized>");
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar1 = std::operator<<((ostream *)&std::cout,"(");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,date->year);
        poVar1 = std::operator<<(poVar1,")");
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      poVar1 = std::operator<<((ostream *)&std::cout,"[");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,date->year);
      poVar1 = std::operator<<(poVar1,"-");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,date->month);
      poVar1 = std::operator<<(poVar1,"]");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,date->year);
    poVar1 = std::operator<<(poVar1,"-");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,date->month);
    poVar1 = std::operator<<(poVar1,"-");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,date->day);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void print(const Date& date)
{
    if(date.month != 0 && date.day != 0)
        std::cout << date.year << "-" << date.month << "-" << date.day << std::endl;
    else if(date.month != 0)
        std::cout << "[" << date.year << "-" << date.month << "]" << std::endl;
    else if(date.year)
        std::cout << "(" << date.year << ")" << std::endl;
    else
        std::cout << "<Uninitialized>" << std::endl;
}